

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O2

int __thiscall CVmObjGramProd::find_literal_in_alts(CVmObjGramProd *this,char *str,size_t len)

{
  char *pcVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  size_t *psVar5;
  size_t i;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  
  pcVar1 = (this->super_CVmObject).ext_;
  uVar2 = *(ulong *)(pcVar1 + 0x38);
  for (uVar6 = 0; uVar6 != uVar2; uVar6 = uVar6 + 1) {
    lVar3 = *(long *)(*(long *)(pcVar1 + 0x30) + uVar6 * 8);
    if (*(int *)(lVar3 + 8) == 0) {
      lVar7 = *(long *)(lVar3 + 0x18);
      psVar5 = (size_t *)(*(long *)(lVar3 + 0x10) + 0x10);
      while (bVar8 = lVar7 != 0, lVar7 = lVar7 + -1, bVar8) {
        if ((*(char *)((long)psVar5 + -0xe) == '\x03') && (*psVar5 == len)) {
          iVar4 = bcmp((void *)psVar5[-1],str,len);
          if (iVar4 == 0) goto LAB_002572a7;
        }
        psVar5 = psVar5 + 4;
      }
    }
  }
LAB_002572a7:
  return (int)(uVar6 < uVar2);
}

Assistant:

int CVmObjGramProd::find_literal_in_alts(const char *str, size_t len)
{
    /* 
     *   Scan the surviving alternatives to see if this same literal token
     *   appears in any of them.  If not, it's no longer in use in the
     *   production, so delete it from the dictionary.  
     */
    for (size_t i = 0 ; i < get_ext()->alt_cnt_ ; ++i)
    {
        /* get this item */
        vmgram_alt_info *alt = get_ext()->alts_[i];
        
        /* if it's being deleted, skip it */
        if (alt->del)
            continue;

        /* it's still alive - scan its tokens */
        vmgram_tok_info *tok = alt->toks;
        for (size_t j = 0 ; j < alt->tok_cnt ; ++j, ++tok)
        {
            /* if this is a matching literal, the word is still in use */
            if (tok->typ == VMGRAM_MATCH_LITERAL
                && tok->typinfo.lit.len == len
                && memcmp(tok->typinfo.lit.str, str, len) == 0)
                return TRUE;
        }
    }

    /* didn't find it */
    return FALSE;
}